

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

double __thiscall Matrix::getMaxValue(Matrix *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = *this->pData;
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->nData;
  if (this->nData < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = this->pData[uVar3];
    if (dVar1 <= dVar4) {
      dVar1 = dVar4;
    }
    dVar4 = dVar1;
  }
  return dVar4;
}

Assistant:

double Matrix::getMaxValue()
{
	double result = pData[0];
	
	for(int i=0; i<nData; i++)
		if (pData[i] > result)
			result = pData[i];

	return result;
}